

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

int QHostInfo::lookupHostImpl
              (QString *name,QObject *receiver,QSlotObjectBase *slotObjRaw,char *member)

{
  long lVar1;
  int *piVar2;
  InterfaceType *this;
  long lVar3;
  Type *this_00;
  QHostInfoRunnable *this_01;
  int id;
  QObject *this_02;
  long in_FS_OFFSET;
  QObject local_a0 [8];
  QSlotObjectBase *local_98;
  QObject local_90 [8];
  QSlotObjectBase *local_88;
  bool valid;
  QObject local_78 [8];
  QSlotObjectBase *local_70;
  QHostInfoResult local_68;
  QHostInfo hostInfo;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (InterfaceType *)QThread::currentThread();
  lVar3 = QAbstractEventDispatcher::instance((QThread *)this);
  if (lVar3 == 0) {
    local_68.super_QObject = (QObject)0x2;
    local_68._1_3_ = 0;
    local_68.receiver.wp.d._4_4_ = 0;
    local_68._4_4_ = 0;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0;
    local_68.receiver.wp.d._0_4_ = 0;
    local_68.receiver.wp.value = (QObject *)0x25e246;
    QMessageLogger::warning
              ((char *)&local_68,"QHostInfo::lookupHost() called with no event dispatcher");
    id = -1;
    goto LAB_00168985;
  }
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QHostInfo>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    this = &QtPrivate::QMetaTypeInterfaceWrapper<QHostInfo>::metaType;
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QHostInfo>::metaType);
  }
  LOCK();
  UNLOCK();
  id = nextId()::counter + 1;
  if ((name->d).size == 0) {
    hostInfo.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    nextId()::counter = nextId()::counter + 1;
    QHostInfo(&hostInfo,id);
    (hostInfo.d_ptr)->err = HostNotFound;
    QCoreApplication::translate((char *)&local_68,"QHostInfo","No host name given",0);
    QString::operator=(&(hostInfo.d_ptr)->errorStr,(QString *)&local_68);
    piVar2 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
      }
    }
    local_68.super_QObject = (QObject)0xaa;
    local_68._1_3_ = 0xaaaaaa;
    local_68._4_4_ = 0xaaaaaaaa;
    local_68._8_4_ = 0xaaaaaaaa;
    local_68._12_4_ = 0xaaaaaaaa;
    local_68.receiver.wp.d._0_4_ = 0xaaaaaaaa;
    local_68.receiver.wp.d._4_4_ = 0xaaaaaaaa;
    local_68.receiver.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.slotObj._M_t.
    super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
          )&DAT_aaaaaaaaaaaaaaaa;
    local_70 = slotObjRaw;
    QHostInfoResult::QHostInfoResult(&local_68,receiver,(SlotObjUniquePtr)&local_70);
    if (local_70 != (QSlotObjectBase *)0x0) {
      LOCK();
      (local_70->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (local_70->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*local_70->m_impl)(0,local_70,(QObject *)0x0,(void **)0x0,(bool *)0x0);
      }
    }
    local_70 = (QSlotObjectBase *)0x0;
    if (member != (char *)0x0) {
      this_02 = local_78;
LAB_001688a9:
      QObject::connect(this_02,(char *)&local_68,(QObject *)"2resultsReady(QHostInfo)",
                       (char *)receiver,(ConnectionType)member);
      QMetaObject::Connection::~Connection((Connection *)this_02);
    }
LAB_001688c5:
    QHostInfoResult::postResultsReady(&local_68,&hostInfo);
    QHostInfoResult::~QHostInfoResult(&local_68);
    ~QHostInfo(&hostInfo);
  }
  else {
    nextId()::counter = nextId()::counter + 1;
    this_00 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
              ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
                            *)this);
    if (this_00 == (Type *)0x0) goto LAB_00168985;
    if (((this_00->cache).enabled._M_base._M_i & 1U) != 0) {
      valid = false;
      hostInfo.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QHostInfoCache::get((QHostInfoCache *)&hostInfo,(QString *)this_00,(bool *)name);
      if (valid == true) {
        (hostInfo.d_ptr)->lookupId = id;
        local_68.super_QObject = (QObject)0xaa;
        local_68._1_3_ = 0xaaaaaa;
        local_68._4_4_ = 0xaaaaaaaa;
        local_68._8_4_ = 0xaaaaaaaa;
        local_68._12_4_ = 0xaaaaaaaa;
        local_68.receiver.wp.d._0_4_ = 0xaaaaaaaa;
        local_68.receiver.wp.d._4_4_ = 0xaaaaaaaa;
        local_68.receiver.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.slotObj._M_t.
        super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
        super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
        super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
              )&DAT_aaaaaaaaaaaaaaaa;
        local_88 = slotObjRaw;
        QHostInfoResult::QHostInfoResult(&local_68,receiver,(SlotObjUniquePtr)&local_88);
        if (local_88 != (QSlotObjectBase *)0x0) {
          LOCK();
          (local_88->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (local_88->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*local_88->m_impl)(0,local_88,(QObject *)0x0,(void **)0x0,(bool *)0x0);
          }
        }
        local_88 = (QSlotObjectBase *)0x0;
        if (member != (char *)0x0) {
          this_02 = local_90;
          goto LAB_001688a9;
        }
        goto LAB_001688c5;
      }
      ~QHostInfo(&hostInfo);
    }
    this_01 = (QHostInfoRunnable *)operator_new(0x58);
    local_98 = slotObjRaw;
    QHostInfoRunnable::QHostInfoRunnable(this_01,name,id,receiver,(SlotObjUniquePtr)&local_98);
    if (local_98 != (QSlotObjectBase *)0x0) {
      LOCK();
      (local_98->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (local_98->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*local_98->m_impl)(0,local_98,(QObject *)0x0,(void **)0x0,(bool *)0x0);
      }
    }
    local_98 = (QSlotObjectBase *)0x0;
    if (member != (char *)0x0) {
      QObject::connect(local_a0,(char *)&this_01->resultEmitter,
                       (QObject *)"2resultsReady(QHostInfo)",(char *)receiver,(ConnectionType)member
                      );
      QMetaObject::Connection::~Connection((Connection *)local_a0);
    }
    QHostInfoLookupManager::scheduleLookup(this_00,this_01);
  }
  slotObjRaw = (QSlotObjectBase *)0x0;
LAB_00168985:
  if (slotObjRaw != (QSlotObjectBase *)0x0) {
    LOCK();
    (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*slotObjRaw->m_impl)(0,slotObjRaw,(QObject *)0x0,(void **)0x0,(bool *)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return id;
  }
  __stack_chk_fail();
}

Assistant:

int QHostInfo::lookupHostImpl(const QString &name,
                              const QObject *receiver,
                              QtPrivate::QSlotObjectBase *slotObjRaw,
                              const char *member)
{
    QtPrivate::SlotObjUniquePtr slotObj{slotObjRaw};
#if defined QHOSTINFO_DEBUG
    qDebug("QHostInfo::lookupHostImpl(\"%s\", %p, %p, %s)",
           name.toLatin1().constData(), receiver, slotObj.get(), member ? member + 1 : 0);
#endif
    Q_ASSERT(!member != !slotObj); // one of these must be set, but not both
    Q_ASSERT(receiver || slotObj);
    Q_ASSERT(!member || receiver); // if member is set, also is receiver
    const bool isUsingStringBasedSlot = static_cast<bool>(member);

    if (!QAbstractEventDispatcher::instance(QThread::currentThread())) {
        qWarning("QHostInfo::lookupHost() called with no event dispatcher");
        return -1;
    }

    qRegisterMetaType<QHostInfo>();

    int id = nextId(); // generate unique ID

    if (Q_UNLIKELY(name.isEmpty())) {
        QHostInfo hostInfo(id);
        hostInfo.setError(QHostInfo::HostNotFound);
        hostInfo.setErrorString(QCoreApplication::translate("QHostInfo", "No host name given"));

        QHostInfoResult result(receiver, std::move(slotObj));
        if (isUsingStringBasedSlot) {
            QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                            receiver, member, Qt::QueuedConnection);
        }
        result.postResultsReady(hostInfo);

        return id;
    }

#ifdef Q_OS_WASM
    // Resolve the host name directly without using a thread or cache,
    // since Emscripten's host lookup is fast. Emscripten maintains an internal
    // mapping of hosts and addresses for the purposes of WebSocket socket
    // tunnelling, and does not perform an actual host lookup.
    QHostInfo hostInfo = QHostInfoAgent::lookup(name);
    hostInfo.setLookupId(id);

    QHostInfoResult result(receiver, std::move(slotObj));
    if (isUsingStringBasedSlot) {
        QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                        receiver, member, Qt::QueuedConnection);
    }
    result.postResultsReady(hostInfo);
#else
    QHostInfoLookupManager *manager = theHostInfoLookupManager();

    if (Q_LIKELY(manager)) {
        // the application is still alive
        if (manager->cache.isEnabled()) {
            // check cache first
            bool valid = false;
            QHostInfo info = manager->cache.get(name, &valid);
            if (valid) {
                info.setLookupId(id);
                QHostInfoResult result(receiver, std::move(slotObj));
                if (isUsingStringBasedSlot) {
                    QObject::connect(&result, SIGNAL(resultsReady(QHostInfo)),
                                    receiver, member, Qt::QueuedConnection);
                }
                result.postResultsReady(info);
                return id;
            }
        }

        // cache is not enabled or it was not in the cache, do normal lookup
        QHostInfoRunnable *runnable = new QHostInfoRunnable(name, id, receiver, std::move(slotObj));
        if (isUsingStringBasedSlot) {
            QObject::connect(&runnable->resultEmitter, SIGNAL(resultsReady(QHostInfo)),
                                receiver, member, Qt::QueuedConnection);
        }
        manager->scheduleLookup(runnable);
    }
#endif // Q_OS_WASM
    return id;
}